

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

bool __thiscall log_queue::push(log_queue *this,log_entry *f)

{
  bool bVar1;
  size_type sVar2;
  unique_lock<std::mutex> lock;
  log_entry *local_30;
  unique_lock<std::mutex> local_28;
  
  local_30 = f;
  std::unique_lock<std::mutex>::unique_lock(&local_28,&this->queue_mutex);
  bVar1 = this->active;
  if (bVar1 == true) {
    sVar2 = std::deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>::size
                      ((deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_> *)
                       this);
    std::deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>::push_back
              ((deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_> *)this,
               &local_30);
    if (sVar2 == 0) {
      std::condition_variable::notify_one();
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return bVar1;
}

Assistant:

bool push(log_entry* f) {
            std::unique_lock<std::mutex> lock(queue_mutex);

            if (active) {
                bool was_empty = (queue.size() == 0);
                queue.push(f);

                if (was_empty) {
                    wait_for_next_item_condition.notify_one();
                }

                return true;
            }

            return false;
        }